

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

char ** mk_attrib_list(char *comma_sep_attrib)

{
  uint uVar1;
  bool local_21;
  char *local_20;
  char *attr;
  uint32 i;
  char *comma_sep_attrib_local;
  
  strncpy(mk_attrib_list::buf,comma_sep_attrib,0x400);
  local_20 = comma_whacker(mk_attrib_list::buf);
  attr._4_4_ = 0;
  do {
    uVar1 = attr._4_4_ + 1;
    mk_attrib_list::attrib_list[attr._4_4_] = local_20;
    local_20 = comma_whacker((char *)0x0);
    local_21 = local_20 != (char *)0x0 && uVar1 < 5;
    attr._4_4_ = uVar1;
  } while (local_21);
  mk_attrib_list::attrib_list[uVar1] = (char *)0x0;
  if (uVar1 == 6) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0x6a,"Attribute list may be truncated for acoustic model, increase MAX_N_ATTRIB\n");
  }
  return mk_attrib_list::attrib_list;
}

Assistant:

const char **
mk_attrib_list(char *comma_sep_attrib)
{
    static char *attrib_list[MAX_N_ATTRIB+1];
    static char buf[1024];
    uint32 i;
    char *attr;

    strncpy (buf, comma_sep_attrib, 1024);

    attr = comma_whacker(buf);
    i = 0;

    do {
	attrib_list[i++] = attr;
    } while ((attr = comma_whacker(NULL)) && (i < MAX_N_ATTRIB));
    attrib_list[i] = NULL;

    if (i == MAX_N_ATTRIB+1) {
	E_WARN("Attribute list may be truncated for acoustic model, increase MAX_N_ATTRIB\n");
    }
    
    return (const char **)attrib_list;
}